

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

int __thiscall sort_5_3::merge_sort_5(sort_5_3 *this,int *a,int low,int high)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  int iVar5;
  ulong uVar6;
  int extraout_EDX;
  int iVar7;
  void *__dest;
  long lVar8;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uStack_40._0_4_ = merge_sort_5(this,a,(low + (int)a) / 2,high);
  uStack_40 = CONCAT44(extraout_var,(int)uStack_40);
  iVar7 = (int)a;
  uVar6 = (ulong)a & 0xffffffff;
  lVar3 = -((ulong)((extraout_EDX - iVar7) + 1) * 4 + 0xf & 0xfffffffffffffff0);
  __dest = (void *)((long)&uStack_40 + lVar3);
  lVar8 = (long)iVar7;
  uStack_40._4_4_ = extraout_EDX;
  if (iVar7 <= extraout_EDX) {
    *(undefined8 *)((long)&uStack_48 + lVar3) = 0x10375d;
    memcpy(__dest,this + lVar8 * 4,(ulong)(uint)(extraout_EDX - iVar7) * 4 + 4);
  }
  iVar4 = high + 1;
  do {
    iVar5 = (int)uVar6;
    if (high < iVar5) {
      *(undefined4 *)(this + lVar8 * 4) = *(undefined4 *)((long)__dest + (long)(iVar4 - iVar7) * 4);
LAB_0010377c:
      iVar4 = iVar4 + 1;
    }
    else {
      iVar1 = *(int *)((long)__dest + (long)(iVar5 - iVar7) * 4);
      if ((iVar4 <= uStack_40._4_4_) &&
         (iVar2 = *(int *)((long)__dest + (long)(iVar4 - iVar7) * 4), iVar2 < iVar1)) {
        *(int *)(this + lVar8 * 4) = iVar2;
        goto LAB_0010377c;
      }
      *(int *)(this + lVar8 * 4) = iVar1;
      uVar6 = (ulong)(iVar5 + 1);
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int merge_sort_5(int *a, int low, int high) {
        if (low < high) {
            int m = (low + high) / 2;
            merge_sort_5(a, low, m);
            merge_sort_5(a, m + 1, high);
            merge_5(a, low, high, m);
        }
    }